

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsDeletePropertyCommon
          (ScriptContext *scriptContext,JsValueRef object,PropertyRecord *propertyRecord,
          bool useStrictRules,JsValueRef *result)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  BOOL BVar3;
  ThreadContext *this;
  undefined4 *puVar4;
  Var pvVar5;
  JsValueRef *result_local;
  bool useStrictRules_local;
  PropertyRecord *propertyRecord_local;
  JsValueRef object_local;
  ScriptContext *scriptContext_local;
  
  this = Js::ScriptContext::GetThreadContext(scriptContext);
  bVar2 = ThreadContext::IsScriptActive(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x71d,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  propertyId = Js::PropertyRecord::GetPropertyId(propertyRecord);
  pvVar5 = Js::JavascriptOperators::OP_DeleteProperty
                     (object,propertyId,scriptContext,(uint)useStrictRules);
  *result = pvVar5;
  if ((*result != (JsValueRef)0x0) &&
     (BVar3 = Js::CrossSite::NeedMarshalVar(*result,scriptContext), BVar3 != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x723,
                       "(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext))"
                       ,
                       "*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return JsNoError;
}

Assistant:

static JsErrorCode JsDeletePropertyCommon(Js::ScriptContext * scriptContext, _In_ JsValueRef object,
    _In_ const Js::PropertyRecord * propertyRecord, _In_ bool useStrictRules, _Out_ JsValueRef *result)
{
    AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

    *result = Js::JavascriptOperators::OP_DeleteProperty((Js::Var)object,
        propertyRecord->GetPropertyId(),
        scriptContext, useStrictRules ? Js::PropertyOperation_StrictMode : Js::PropertyOperation_None);

    Assert(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext));

    return JsNoError;
}